

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroQueuedPages(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  *this)

{
  uint pageCount;
  undefined4 *puVar1;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  HANDLE pVVar2;
  code *pcVar3;
  bool bVar4;
  FreePageEntry *__s;
  HANDLE pVVar5;
  ulong __n;
  undefined8 *in_FS_OFFSET;
  
  bVar4 = HasZeroPageQueue(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x6f5,"(HasZeroPageQueue())","HasZeroPageQueue()");
    if (!bVar4) {
LAB_0025d56e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  __s = PopPendingZeroPage(this);
  if (__s != (FreePageEntry *)0x0) {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    do {
      segment = __s->segment;
      pageCount = __s->pageCount;
      pVVar2 = this->processHandle;
      pVVar5 = GetCurrentProcess();
      if (pVVar2 != pVVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x705,"(this->processHandle == GetCurrentProcess())",
                           "this->processHandle == GetCurrentProcess()");
        if (!bVar4) goto LAB_0025d56e;
        *puVar1 = 0;
      }
      __n = (ulong)(pageCount << 0xc);
      if (Js::Configuration::Global[0x2c11c] == '\x01') {
        js_memset_zero_nontemporal(__s,__n);
      }
      else {
        memset(__s,0,__n);
      }
      QueuePages(this,__s,pageCount,segment);
      __s = PopPendingZeroPage(this);
    } while (__s != (FreePageEntry *)0x0);
  }
  this->hasZeroQueuedPages = false;
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ZeroQueuedPages()
{
    Assert(HasZeroPageQueue());

    while (true)
    {
        FreePageEntry * freePageEntry = PopPendingZeroPage();
        if (freePageEntry == nullptr)
        {
            break;
        }
        TPageSegment * segment = freePageEntry->segment;
        uint pageCount = freePageEntry->pageCount;

        //
        // Do memset via non-temporal store to avoid evicting existing processor cache.
        // This helps low-end machines with limited cache size.
        //
        Assert(this->processHandle == GetCurrentProcess());
#if defined(_M_IX86) || defined(_M_X64)
        if (CONFIG_FLAG(ZeroMemoryWithNonTemporalStore))
        {
            js_memset_zero_nontemporal(freePageEntry, AutoSystemInfo::PageSize * pageCount);
        }
        else
#endif
        {
            memset(freePageEntry, 0, pageCount * AutoSystemInfo::PageSize);
        }

        QueuePages(freePageEntry, pageCount, segment);
    }
    this->hasZeroQueuedPages = false;
}